

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool libcellml::traverseHierarchyAndRemoveIfEmpty(ComponentPtr *component)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  string sStack_88;
  string local_68;
  string local_48;
  
  sVar2 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  while (sVar2 = sVar2 - 1, sVar2 != 0xffffffffffffffff) {
    ComponentEntity::component
              ((ComponentEntity *)&sStack_88,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    bVar1 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)&sStack_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_88._M_string_length);
    if (bVar1) {
      ComponentEntity::removeComponent
                (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ComponentEntity,sVar2);
    }
  }
  sVar2 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar3 = Component::resetCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sVar4 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar4 + sVar3 + sVar2 == 0) {
    Component::math_abi_cxx11_
              (&sStack_88,
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    if ((sStack_88._M_string_length != 0) ||
       (bVar1 = ImportedEntity::isImport
                          (&((component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->super_ImportedEntity), bVar1)) {
      bVar1 = false;
    }
    else {
      NamedEntity::name_abi_cxx11_
                (&local_68,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      if (local_68._M_string_length == 0) {
        Entity::id_abi_cxx11_
                  (&local_48,
                   (Entity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        bVar1 = local_48._M_string_length == 0;
        std::__cxx11::string::~string((string *)&local_48);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__cxx11::string::~string((string *)&sStack_88);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool traverseHierarchyAndRemoveIfEmpty(const ComponentPtr &component)
{
    for (size_t i = component->componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component->component(i))) {
            component->removeComponent(i);
        }
    }

    return (component->variableCount() + component->resetCount() + component->componentCount() == 0)
           && component->math().empty()
           && !component->isImport()
           && component->name().empty()
           && component->id().empty();
}